

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

xchar level_difficulty(d_level *dlev)

{
  schar sVar1;
  d_level *dlev_local;
  
  if (dlev->dnum == dungeon_topology.d_astral_level.dnum) {
    sVar1 = depth(&dungeon_topology.d_sanctum_level);
    dlev_local._7_1_ = sVar1 + '\x0f';
  }
  else if ((u.uhave._0_1_ & 1) == 0) {
    dlev_local._7_1_ = depth(dlev);
  }
  else {
    dlev_local._7_1_ = deepest_lev_reached('\0');
  }
  return dlev_local._7_1_;
}

Assistant:

xchar level_difficulty(const d_level *dlev)
{
	if (In_endgame(dlev))
		return (xchar)(depth(&sanctum_level) + 15);
	else
		if (u.uhave.amulet)
			return deepest_lev_reached(FALSE);
		else
			return (xchar) depth(dlev);
}